

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::TestCaseInfo::addFilenameTag(TestCaseInfo *this)

{
  StringRef rhs;
  StringRef tagStr;
  StringRef *in_RDI;
  StringRef SVar1;
  string combined;
  string *in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff78;
  TestCaseInfo *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  allocator<char> local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
             (allocator<char> *)in_stack_ffffffffffffffa0);
  std::allocator<char>::~allocator(&local_29);
  StringRef::StringRef(in_RDI,in_stack_ffffffffffffff78);
  SVar1.m_size = (size_type)in_RDI;
  SVar1.m_start = in_stack_ffffffffffffff78;
  SVar1 = anon_unknown_26::extractFilenamePart(SVar1);
  SVar1.m_start = SVar1.m_start;
  rhs.m_size = (size_type)in_RDI;
  rhs.m_start = SVar1.m_start;
  operator+=((string *)SVar1.m_size,rhs);
  StringRef::StringRef((StringRef *)SVar1.m_size,in_stack_ffffffffffffff68);
  tagStr.m_size = (size_type)SVar1.m_start;
  tagStr.m_start = in_stack_ffffffffffffffa8;
  internalAppendTag(in_stack_ffffffffffffffa0,tagStr);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void TestCaseInfo::addFilenameTag() {
        std::string combined("#");
        combined += extractFilenamePart(lineInfo.file);
        internalAppendTag(combined);
    }